

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O0

void __thiscall
GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest
          (GenericFunctionInstanceTypeRequest *this,TypeBase *parentType,FunctionData *function,
          IntrusiveList<TypeHandle> arguments,IntrusiveList<MatchData> aliases)

{
  uint local_54;
  MatchData *local_40;
  MatchData *curr_1;
  TypeHandle *curr;
  FunctionData *function_local;
  TypeBase *parentType_local;
  GenericFunctionInstanceTypeRequest *this_local;
  IntrusiveList<TypeHandle> arguments_local;
  
  curr_1 = (MatchData *)arguments.head;
  this->parentType = parentType;
  this->function = function;
  (this->arguments).head = (TypeHandle *)curr_1;
  (this->arguments).tail = arguments.tail;
  (this->aliases).head = aliases.head;
  (this->aliases).tail = aliases.tail;
  if (parentType == (TypeBase *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = parentType->nameHash;
  }
  this->hash = local_54;
  this->hash = this->hash + this->hash * 0x20 + function->nameHash;
  for (; curr_1 != (MatchData *)0x0; curr_1 = (MatchData *)curr_1->type) {
    this->hash = this->hash + this->hash * 0x20 + *(int *)&(curr_1->name->super_SynBase).field_0xc;
  }
  for (local_40 = aliases.head; local_40 != (MatchData *)0x0; local_40 = local_40->next) {
    this->hash = this->hash + this->hash * 0x20 + local_40->type->nameHash;
  }
  return;
}

Assistant:

GenericFunctionInstanceTypeRequest(TypeBase *parentType, FunctionData *function, IntrusiveList<TypeHandle> arguments, IntrusiveList<MatchData> aliases): parentType(parentType), function(function), arguments(arguments), aliases(aliases)
	{
		hash = parentType ? parentType->nameHash : 0;

		hash = hash + (hash << 5) + function->nameHash;

		for(TypeHandle *curr = arguments.head; curr; curr = curr->next)
			hash = hash + (hash << 5) + curr->type->nameHash;

		for(MatchData *curr = aliases.head; curr; curr = curr->next)
			hash = hash + (hash << 5) + curr->type->nameHash;
	}